

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::check_explicit_lod_allowed(CompilerGLSL *this,uint32_t lod)

{
  bool bVar1;
  CompilerError *this_00;
  float fVar2;
  bool local_66;
  allocator local_51;
  string local_50 [32];
  SPIRConstant *local_30;
  SPIRConstant *lod_constant;
  SPIREntryPoint *pSStack_20;
  bool allowed;
  SPIREntryPoint *execution;
  CompilerGLSL *pCStack_10;
  uint32_t lod_local;
  CompilerGLSL *this_local;
  
  execution._4_4_ = lod;
  pCStack_10 = this;
  pSStack_20 = Compiler::get_entry_point(&this->super_Compiler);
  bVar1 = is_legacy_es(this);
  local_66 = true;
  if (bVar1) {
    local_66 = pSStack_20->model == ExecutionModelFragment;
  }
  lod_constant._7_1_ = local_66;
  if ((local_66 == false) && (execution._4_4_ != 0)) {
    local_30 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,execution._4_4_)
    ;
    if (local_30 != (SPIRConstant *)0x0) {
      fVar2 = SPIRConstant::scalar_f32(local_30,0,0);
      if ((fVar2 == 0.0) && (!NAN(fVar2))) goto LAB_002f9e5c;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_50,"Explicit lod not allowed in legacy ES non-fragment shaders.",&local_51);
    CompilerError::CompilerError(this_00,(string *)local_50);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
LAB_002f9e5c:
  return (bool)(lod_constant._7_1_ & 1);
}

Assistant:

bool CompilerGLSL::check_explicit_lod_allowed(uint32_t lod)
{
	auto &execution = get_entry_point();
	bool allowed = !is_legacy_es() || execution.model == ExecutionModelFragment;
	if (!allowed && lod != 0)
	{
		auto *lod_constant = maybe_get<SPIRConstant>(lod);
		if (!lod_constant || lod_constant->scalar_f32() != 0.0f)
		{
			SPIRV_CROSS_THROW("Explicit lod not allowed in legacy ES non-fragment shaders.");
		}
	}
	return allowed;
}